

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-timesamples-array.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseTimeSampleValueOfArrayType
          (AsciiParser *this,uint32_t type_id,Value *result)

{
  bool bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  uint32_t tyid;
  uint32_t tyid_00;
  uint32_t tyid_01;
  uint32_t tyid_02;
  uint32_t tyid_03;
  uint32_t tyid_04;
  uint32_t tyid_05;
  uint32_t tyid_06;
  uint32_t tyid_07;
  uint32_t tyid_08;
  uint32_t tyid_09;
  uint32_t tyid_10;
  uint32_t tyid_11;
  uint32_t tyid_12;
  uint32_t tyid_13;
  uint32_t tyid_14;
  uint32_t tyid_15;
  uint32_t tyid_16;
  uint32_t tyid_17;
  uint32_t tyid_18;
  uint32_t tyid_19;
  uint32_t tyid_20;
  uint32_t tyid_21;
  uint32_t tyid_22;
  uint32_t tyid_23;
  uint32_t tyid_24;
  uint32_t tyid_25;
  uint32_t tyid_26;
  uint32_t tyid_27;
  uint32_t tyid_28;
  uint32_t tyid_29;
  uint32_t tyid_30;
  uint32_t tyid_31;
  uint32_t tyid_32;
  uint32_t tyid_33;
  uint32_t tyid_34;
  uint32_t tyid_35;
  uint32_t tyid_36;
  uint32_t tyid_37;
  string local_5418;
  string local_53f8;
  string local_53d8 [32];
  ostringstream local_53b8 [8];
  ostringstream ss_e_38;
  Value local_5240;
  string local_5228;
  string local_5208;
  string local_51e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_51c8 [32];
  ostringstream local_51a8 [8];
  ostringstream ss_e_37;
  undefined1 local_5030 [8];
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> typed_val_37;
  string local_5000;
  string local_4fe0;
  string local_4fc0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4fa0 [32];
  ostringstream local_4f80 [8];
  ostringstream ss_e_36;
  undefined1 local_4e08 [8];
  vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> typed_val_36;
  string local_4dd8;
  string local_4db8;
  string local_4d98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d78 [32];
  ostringstream local_4d58 [8];
  ostringstream ss_e_35;
  undefined1 local_4be0 [8];
  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> typed_val_35;
  string local_4bb0;
  string local_4b90;
  string local_4b70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b50 [32];
  ostringstream local_4b30 [8];
  ostringstream ss_e_34;
  undefined1 local_49b8 [8];
  vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> typed_val_34;
  string local_4988;
  string local_4968;
  string local_4948 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4928 [32];
  ostringstream local_4908 [8];
  ostringstream ss_e_33;
  undefined1 local_4790 [8];
  vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> typed_val_33;
  string local_4760;
  string local_4740;
  string local_4720 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4700 [32];
  ostringstream local_46e0 [8];
  ostringstream ss_e_32;
  undefined1 local_4568 [8];
  vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> typed_val_32;
  string local_4538;
  string local_4518;
  string local_44f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_44d8 [32];
  ostringstream local_44b8 [8];
  ostringstream ss_e_31;
  undefined1 local_4340 [8];
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> typed_val_31;
  string local_4310;
  string local_42f0;
  string local_42d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_42b0 [32];
  ostringstream local_4290 [8];
  ostringstream ss_e_30;
  undefined1 local_4118 [8];
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> typed_val_30;
  string local_40e8;
  string local_40c8;
  string local_40a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4088 [32];
  ostringstream local_4068 [8];
  ostringstream ss_e_29;
  undefined1 local_3ef0 [8];
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> typed_val_29;
  string local_3ec0;
  string local_3ea0;
  string local_3e80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e60 [32];
  ostringstream local_3e40 [8];
  ostringstream ss_e_28;
  undefined1 local_3cc8 [8];
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> typed_val_28;
  string local_3c98;
  string local_3c78;
  string local_3c58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c38 [32];
  ostringstream local_3c18 [8];
  ostringstream ss_e_27;
  undefined1 local_3aa0 [8];
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> typed_val_27;
  string local_3a70;
  string local_3a50;
  string local_3a30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a10 [32];
  ostringstream local_39f0 [8];
  ostringstream ss_e_26;
  undefined1 local_3878 [8];
  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> typed_val_26;
  string local_3848;
  string local_3828;
  string local_3808 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_37e8 [32];
  ostringstream local_37c8 [8];
  ostringstream ss_e_25;
  undefined1 local_3650 [8];
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> typed_val_25;
  string local_3620;
  string local_3600;
  string local_35e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_35c0 [32];
  ostringstream local_35a0 [8];
  ostringstream ss_e_24;
  undefined1 local_3428 [8];
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> typed_val_24;
  string local_33f8;
  string local_33d8;
  string local_33b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3398 [32];
  ostringstream local_3378 [8];
  ostringstream ss_e_23;
  undefined1 local_3200 [8];
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> typed_val_23;
  string local_31d0;
  string local_31b0;
  string local_3190 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3170 [32];
  ostringstream local_3150 [8];
  ostringstream ss_e_22;
  undefined1 local_2fd8 [8];
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> typed_val_22;
  string local_2fa8;
  string local_2f88;
  string local_2f68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f48 [32];
  ostringstream local_2f28 [8];
  ostringstream ss_e_21;
  undefined1 local_2db0 [8];
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> typed_val_21;
  string local_2d80;
  string local_2d60;
  string local_2d40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d20 [32];
  ostringstream local_2d00 [8];
  ostringstream ss_e_20;
  undefined1 local_2b88 [8];
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> typed_val_20;
  string local_2b58;
  string local_2b38;
  string local_2b18 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2af8 [32];
  ostringstream local_2ad8 [8];
  ostringstream ss_e_19;
  undefined1 local_2960 [8];
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> typed_val_19;
  string local_2930;
  string local_2910;
  string local_28f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28d0 [32];
  ostringstream local_28b0 [8];
  ostringstream ss_e_18;
  undefined1 local_2738 [8];
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> typed_val_18;
  string local_2708;
  string local_26e8;
  string local_26c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_26a8 [32];
  ostringstream local_2688 [8];
  ostringstream ss_e_17;
  undefined1 local_2510 [8];
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> typed_val_17;
  string local_24e0;
  string local_24c0;
  string local_24a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2480 [32];
  ostringstream local_2460 [8];
  ostringstream ss_e_16;
  undefined1 local_22e8 [8];
  vector<double,_std::allocator<double>_> typed_val_16;
  string local_22b8;
  string local_2298;
  string local_2278 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2258 [32];
  ostringstream local_2238 [8];
  ostringstream ss_e_15;
  undefined1 local_20c0 [8];
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> typed_val_15;
  string local_2090;
  string local_2070;
  string local_2050 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2030 [32];
  ostringstream local_2010 [8];
  ostringstream ss_e_14;
  undefined1 local_1e98 [8];
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> typed_val_14;
  string local_1e68;
  string local_1e48;
  string local_1e28 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e08 [32];
  ostringstream local_1de8 [8];
  ostringstream ss_e_13;
  undefined1 local_1c70 [8];
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> typed_val_13;
  string local_1c40;
  string local_1c20;
  string local_1c00 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1be0 [32];
  ostringstream local_1bc0 [8];
  ostringstream ss_e_12;
  undefined1 local_1a48 [8];
  vector<float,_std::allocator<float>_> typed_val_12;
  string local_1a18;
  string local_19f8;
  string local_19d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19b8 [32];
  ostringstream local_1998 [8];
  ostringstream ss_e_11;
  undefined1 local_1820 [8];
  vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  typed_val_11;
  string local_17f0;
  string local_17d0;
  string local_17b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1790 [32];
  ostringstream local_1770 [8];
  ostringstream ss_e_10;
  undefined1 local_15f8 [8];
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  typed_val_10;
  string local_15c8;
  string local_15a8;
  string local_1588 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1568 [32];
  ostringstream local_1548 [8];
  ostringstream ss_e_9;
  undefined1 local_13d0 [8];
  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  typed_val_9;
  string local_13a0;
  string local_1380;
  string local_1360 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1340 [32];
  ostringstream local_1320 [8];
  ostringstream ss_e_8;
  undefined1 local_11a8 [8];
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> typed_val_8;
  string local_1178;
  string local_1158;
  string local_1138 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1118 [32];
  ostringstream local_10f8 [8];
  ostringstream ss_e_7;
  undefined1 local_f80 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> typed_val_7;
  string local_f50;
  string local_f30;
  string local_f10 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef0 [32];
  ostringstream local_ed0 [8];
  ostringstream ss_e_6;
  undefined1 local_d58 [8];
  vector<long,_std::allocator<long>_> typed_val_6;
  string local_d28;
  string local_d08;
  string local_ce8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8 [32];
  ostringstream local_ca8 [8];
  ostringstream ss_e_5;
  undefined1 local_b30 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> typed_val_5;
  string local_b00;
  string local_ae0;
  string local_ac0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa0 [32];
  ostringstream local_a80 [8];
  ostringstream ss_e_4;
  undefined1 local_908 [8];
  vector<int,_std::allocator<int>_> typed_val_4;
  string local_8d8;
  string local_8b8;
  string local_898 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878 [32];
  ostringstream local_858 [8];
  ostringstream ss_e_3;
  undefined1 local_6e0 [8];
  vector<float,_std::allocator<float>_> typed_val_3;
  string local_6b0;
  string local_690;
  string local_670 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650 [32];
  ostringstream local_630 [8];
  ostringstream ss_e_2;
  undefined1 local_4b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  typed_val_2;
  string local_488;
  string local_468;
  string local_448 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428 [32];
  ostringstream local_408 [8];
  ostringstream ss_e_1;
  undefined1 local_290 [8];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> typed_val_1;
  string local_258;
  string local_238;
  string local_218 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8 [32];
  ostringstream local_1d8 [8];
  ostringstream ss_e;
  undefined1 local_60 [8];
  vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> typed_val;
  Value val;
  Value *result_local;
  uint32_t type_id_local;
  AsciiParser *this_local;
  
  if (result == (Value *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_00624298;
  }
  bVar1 = MaybeNone(this);
  if (bVar1) {
    tinyusdz::value::Value::operator=(result,(ValueBlock *)((long)&val.v_.vtable + 7));
    this_local._7_1_ = 1;
    goto LAB_00624298;
  }
  tinyusdz::value::Value::Value
            ((Value *)&typed_val.
                       super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar2 = tinyusdz::value::TypeTraits<tinyusdz::value::AssetPath>::type_id();
  if (type_id == uVar2) {
    ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::vector
              ((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
               local_60);
    bVar1 = ParseBasicTypeArray<tinyusdz::value::AssetPath>
                      (this,(vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                             *)local_60);
    if (bVar1) {
      tinyusdz::value::Value::
      Value<std::vector<tinyusdz::value::AssetPath,std::allocator<tinyusdz::value::AssetPath>>>
                ((Value *)&typed_val_1.
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
                 local_60);
      tinyusdz::value::Value::operator=
                ((Value *)&typed_val.
                           super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (Value *)&typed_val_1.
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      tinyusdz::value::Value::~Value
                ((Value *)&typed_val_1.
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1d8);
      poVar3 = ::std::operator<<((ostream *)local_1d8,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValueOfArrayType");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xa5);
      ::std::operator<<(poVar3," ");
      tinyusdz::value::GetTypeName_abi_cxx11_(&local_238,(value *)(ulong)type_id,tyid);
      ::std::operator+((char *)local_218,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Failed to parse value with requested type `");
      ::std::operator+(local_1f8,(char *)local_218);
      poVar3 = ::std::operator<<((ostream *)local_1d8,(string *)local_1f8);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::string::~string((string *)local_1f8);
      ::std::__cxx11::string::~string(local_218);
      ::std::__cxx11::string::~string((string *)&local_238);
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_258);
      ::std::__cxx11::string::~string((string *)&local_258);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_1d8);
    }
    ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::~vector
              ((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
               local_60);
    if (bVar1) {
LAB_00624274:
      tinyusdz::value::Value::operator=
                (result,(Value *)&typed_val.
                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 1;
    }
  }
  else {
    uVar2 = tinyusdz::value::TypeTraits<tinyusdz::Token>::type_id();
    if (type_id == uVar2) {
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_290);
      bVar1 = ParseBasicTypeArray<tinyusdz::Token>
                        (this,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_290
                        );
      if (bVar1) {
        tinyusdz::value::Value::Value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                  ((Value *)&typed_val_2.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_290);
        tinyusdz::value::Value::operator=
                  ((Value *)&typed_val.
                             super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (Value *)&typed_val_2.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        tinyusdz::value::Value::~Value
                  ((Value *)&typed_val_2.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_408);
        poVar3 = ::std::operator<<((ostream *)local_408,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValueOfArrayType");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xa6);
        ::std::operator<<(poVar3," ");
        tinyusdz::value::GetTypeName_abi_cxx11_(&local_468,(value *)(ulong)type_id,tyid_00);
        ::std::operator+((char *)local_448,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Failed to parse value with requested type `");
        ::std::operator+(local_428,(char *)local_448);
        poVar3 = ::std::operator<<((ostream *)local_408,(string *)local_428);
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::string::~string((string *)local_428);
        ::std::__cxx11::string::~string(local_448);
        ::std::__cxx11::string::~string((string *)&local_468);
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_488);
        ::std::__cxx11::string::~string((string *)&local_488);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_408);
      }
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_290);
      if (bVar1) goto LAB_00624274;
    }
    else {
      uVar2 = tinyusdz::value::
              TypeTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::type_id();
      if (type_id == uVar2) {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_4b8);
        bVar1 = ParseBasicTypeArray<std::__cxx11::string>
                          (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_4b8);
        if (bVar1) {
          tinyusdz::value::Value::
          Value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((Value *)&typed_val_3.super__Vector_base<float,_std::allocator<float>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_4b8);
          tinyusdz::value::Value::operator=
                    ((Value *)&typed_val.
                               super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (Value *)&typed_val_3.super__Vector_base<float,_std::allocator<float>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage);
          tinyusdz::value::Value::~Value
                    ((Value *)&typed_val_3.super__Vector_base<float,_std::allocator<float>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_630);
          poVar3 = ::std::operator<<((ostream *)local_630,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValueOfArrayType");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xa7);
          ::std::operator<<(poVar3," ");
          tinyusdz::value::GetTypeName_abi_cxx11_(&local_690,(value *)(ulong)type_id,tyid_01);
          ::std::operator+((char *)local_670,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Failed to parse value with requested type `");
          ::std::operator+(local_650,(char *)local_670);
          poVar3 = ::std::operator<<((ostream *)local_630,(string *)local_650);
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::string::~string((string *)local_650);
          ::std::__cxx11::string::~string(local_670);
          ::std::__cxx11::string::~string((string *)&local_690);
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_6b0);
          ::std::__cxx11::string::~string((string *)&local_6b0);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_630);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_4b8);
        if (bVar1) goto LAB_00624274;
      }
      else {
        uVar2 = tinyusdz::value::TypeTraits<float>::type_id();
        if (type_id == uVar2) {
          ::std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)local_6e0);
          bVar1 = ParseBasicTypeArray<float>
                            (this,(vector<float,_std::allocator<float>_> *)local_6e0);
          if (bVar1) {
            tinyusdz::value::Value::Value<std::vector<float,std::allocator<float>>>
                      ((Value *)&typed_val_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,
                       (vector<float,_std::allocator<float>_> *)local_6e0);
            tinyusdz::value::Value::operator=
                      ((Value *)&typed_val.
                                 super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (Value *)&typed_val_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
            tinyusdz::value::Value::~Value
                      ((Value *)&typed_val_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_858);
            poVar3 = ::std::operator<<((ostream *)local_858,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValueOfArrayType");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xa8);
            ::std::operator<<(poVar3," ");
            tinyusdz::value::GetTypeName_abi_cxx11_(&local_8b8,(value *)(ulong)type_id,tyid_02);
            ::std::operator+((char *)local_898,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "Failed to parse value with requested type `");
            ::std::operator+(local_878,(char *)local_898);
            poVar3 = ::std::operator<<((ostream *)local_858,(string *)local_878);
            ::std::operator<<(poVar3,"\n");
            ::std::__cxx11::string::~string((string *)local_878);
            ::std::__cxx11::string::~string(local_898);
            ::std::__cxx11::string::~string((string *)&local_8b8);
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_8d8);
            ::std::__cxx11::string::~string((string *)&local_8d8);
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_858);
          }
          ::std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)local_6e0);
          if (bVar1) goto LAB_00624274;
        }
        else {
          uVar2 = tinyusdz::value::TypeTraits<int>::type_id();
          if (type_id == uVar2) {
            ::std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_908);
            bVar1 = ParseBasicTypeArray<int>(this,(vector<int,_std::allocator<int>_> *)local_908);
            if (bVar1) {
              tinyusdz::value::Value::Value<std::vector<int,std::allocator<int>>>
                        ((Value *)&typed_val_5.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<int,_std::allocator<int>_> *)local_908);
              tinyusdz::value::Value::operator=
                        ((Value *)&typed_val.
                                   super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Value *)&typed_val_5.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
              tinyusdz::value::Value::~Value
                        ((Value *)&typed_val_5.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_a80);
              poVar3 = ::std::operator<<((ostream *)local_a80,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValueOfArrayType");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xa9);
              ::std::operator<<(poVar3," ");
              tinyusdz::value::GetTypeName_abi_cxx11_(&local_ae0,(value *)(ulong)type_id,tyid_03);
              ::std::operator+((char *)local_ac0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "Failed to parse value with requested type `");
              ::std::operator+(local_aa0,(char *)local_ac0);
              poVar3 = ::std::operator<<((ostream *)local_a80,(string *)local_aa0);
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::string::~string((string *)local_aa0);
              ::std::__cxx11::string::~string(local_ac0);
              ::std::__cxx11::string::~string((string *)&local_ae0);
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_b00);
              ::std::__cxx11::string::~string((string *)&local_b00);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_a80);
            }
            ::std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)local_908);
            if (bVar1) goto LAB_00624274;
          }
          else {
            uVar2 = tinyusdz::value::TypeTraits<unsigned_int>::type_id();
            if (type_id == uVar2) {
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b30);
              bVar1 = ParseBasicTypeArray<unsigned_int>
                                (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      local_b30);
              if (bVar1) {
                tinyusdz::value::Value::
                Value<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          ((Value *)&typed_val_6.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b30);
                tinyusdz::value::Value::operator=
                          ((Value *)&typed_val.
                                     super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (Value *)&typed_val_6.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
                tinyusdz::value::Value::~Value
                          ((Value *)&typed_val_6.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_ca8);
                poVar3 = ::std::operator<<((ostream *)local_ca8,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValueOfArrayType");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xaa);
                ::std::operator<<(poVar3," ");
                tinyusdz::value::GetTypeName_abi_cxx11_(&local_d08,(value *)(ulong)type_id,tyid_04);
                ::std::operator+((char *)local_ce8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)"Failed to parse value with requested type `");
                ::std::operator+(local_cc8,(char *)local_ce8);
                poVar3 = ::std::operator<<((ostream *)local_ca8,(string *)local_cc8);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_cc8);
                ::std::__cxx11::string::~string(local_ce8);
                ::std::__cxx11::string::~string((string *)&local_d08);
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_d28);
                ::std::__cxx11::string::~string((string *)&local_d28);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_ca8);
              }
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b30);
              if (bVar1) goto LAB_00624274;
            }
            else {
              uVar2 = tinyusdz::value::TypeTraits<long>::type_id();
              if (type_id == uVar2) {
                ::std::vector<long,_std::allocator<long>_>::vector
                          ((vector<long,_std::allocator<long>_> *)local_d58);
                bVar1 = ParseBasicTypeArray<long>
                                  (this,(vector<long,_std::allocator<long>_> *)local_d58);
                if (bVar1) {
                  tinyusdz::value::Value::Value<std::vector<long,std::allocator<long>>>
                            ((Value *)&typed_val_7.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (vector<long,_std::allocator<long>_> *)local_d58);
                  tinyusdz::value::Value::operator=
                            ((Value *)&typed_val.
                                       super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (Value *)&typed_val_7.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  tinyusdz::value::Value::~Value
                            ((Value *)&typed_val_7.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_ed0);
                  poVar3 = ::std::operator<<((ostream *)local_ed0,"[error]");
                  poVar3 = ::std::operator<<(poVar3,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                            );
                  poVar3 = ::std::operator<<(poVar3,":");
                  poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValueOfArrayType");
                  poVar3 = ::std::operator<<(poVar3,"():");
                  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xab);
                  ::std::operator<<(poVar3," ");
                  tinyusdz::value::GetTypeName_abi_cxx11_
                            (&local_f30,(value *)(ulong)type_id,tyid_05);
                  ::std::operator+((char *)local_f10,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)"Failed to parse value with requested type `");
                  ::std::operator+(local_ef0,(char *)local_f10);
                  poVar3 = ::std::operator<<((ostream *)local_ed0,(string *)local_ef0);
                  ::std::operator<<(poVar3,"\n");
                  ::std::__cxx11::string::~string((string *)local_ef0);
                  ::std::__cxx11::string::~string(local_f10);
                  ::std::__cxx11::string::~string((string *)&local_f30);
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,&local_f50);
                  ::std::__cxx11::string::~string((string *)&local_f50);
                  this_local._7_1_ = 0;
                  ::std::__cxx11::ostringstream::~ostringstream(local_ed0);
                }
                ::std::vector<long,_std::allocator<long>_>::~vector
                          ((vector<long,_std::allocator<long>_> *)local_d58);
                if (bVar1) goto LAB_00624274;
              }
              else {
                uVar2 = tinyusdz::value::TypeTraits<unsigned_long>::type_id();
                if (type_id == uVar2) {
                  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f80);
                  bVar1 = ParseBasicTypeArray<unsigned_long>
                                    (this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          local_f80);
                  if (bVar1) {
                    tinyusdz::value::Value::
                    Value<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                              ((Value *)&typed_val_8.
                                         super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f80);
                    tinyusdz::value::Value::operator=
                              ((Value *)&typed_val.
                                         super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (Value *)&typed_val_8.
                                         super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    tinyusdz::value::Value::~Value
                              ((Value *)&typed_val_8.
                                         super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream(local_10f8);
                    poVar3 = ::std::operator<<((ostream *)local_10f8,"[error]");
                    poVar3 = ::std::operator<<(poVar3,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                              );
                    poVar3 = ::std::operator<<(poVar3,":");
                    poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValueOfArrayType");
                    poVar3 = ::std::operator<<(poVar3,"():");
                    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xac);
                    ::std::operator<<(poVar3," ");
                    tinyusdz::value::GetTypeName_abi_cxx11_
                              (&local_1158,(value *)(ulong)type_id,tyid_06);
                    ::std::operator+((char *)local_1138,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)"Failed to parse value with requested type `");
                    ::std::operator+(local_1118,(char *)local_1138);
                    poVar3 = ::std::operator<<((ostream *)local_10f8,(string *)local_1118);
                    ::std::operator<<(poVar3,"\n");
                    ::std::__cxx11::string::~string((string *)local_1118);
                    ::std::__cxx11::string::~string(local_1138);
                    ::std::__cxx11::string::~string((string *)&local_1158);
                    ::std::__cxx11::ostringstream::str();
                    PushError(this,&local_1178);
                    ::std::__cxx11::string::~string((string *)&local_1178);
                    this_local._7_1_ = 0;
                    ::std::__cxx11::ostringstream::~ostringstream(local_10f8);
                  }
                  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f80);
                  if (bVar1) goto LAB_00624274;
                }
                else {
                  uVar2 = tinyusdz::value::TypeTraits<tinyusdz::value::half>::type_id();
                  if (type_id == uVar2) {
                    ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
                    vector((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                           local_11a8);
                    bVar1 = ParseBasicTypeArray<tinyusdz::value::half>
                                      (this,(vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                             *)local_11a8);
                    if (bVar1) {
                      tinyusdz::value::Value::
                      Value<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                                ((Value *)&typed_val_9.
                                           super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                  *)local_11a8);
                      tinyusdz::value::Value::operator=
                                ((Value *)&typed_val.
                                           super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (Value *)&typed_val_9.
                                           super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      tinyusdz::value::Value::~Value
                                ((Value *)&typed_val_9.
                                           super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    }
                    else {
                      ::std::__cxx11::ostringstream::ostringstream(local_1320);
                      poVar3 = ::std::operator<<((ostream *)local_1320,"[error]");
                      poVar3 = ::std::operator<<(poVar3,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                );
                      poVar3 = ::std::operator<<(poVar3,":");
                      poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValueOfArrayType");
                      poVar3 = ::std::operator<<(poVar3,"():");
                      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xad);
                      ::std::operator<<(poVar3," ");
                      tinyusdz::value::GetTypeName_abi_cxx11_
                                (&local_1380,(value *)(ulong)type_id,tyid_07);
                      ::std::operator+((char *)local_1360,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)"Failed to parse value with requested type `");
                      ::std::operator+(local_1340,(char *)local_1360);
                      poVar3 = ::std::operator<<((ostream *)local_1320,(string *)local_1340);
                      ::std::operator<<(poVar3,"\n");
                      ::std::__cxx11::string::~string((string *)local_1340);
                      ::std::__cxx11::string::~string(local_1360);
                      ::std::__cxx11::string::~string((string *)&local_1380);
                      ::std::__cxx11::ostringstream::str();
                      PushError(this,&local_13a0);
                      ::std::__cxx11::string::~string((string *)&local_13a0);
                      this_local._7_1_ = 0;
                      ::std::__cxx11::ostringstream::~ostringstream(local_1320);
                    }
                    ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
                    ~vector((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *
                            )local_11a8);
                    if (bVar1) goto LAB_00624274;
                  }
                  else {
                    uVar2 = tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,_2UL>_>::
                            type_id();
                    if (type_id == uVar2) {
                      ::std::
                      vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                      ::vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                                *)local_13d0);
                      bVar1 = ParseBasicTypeArray<std::array<tinyusdz::value::half,2ul>>
                                        (this,(vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                                               *)local_13d0);
                      if (bVar1) {
                        tinyusdz::value::Value::
                        Value<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                                  ((Value *)&typed_val_10.
                                             super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                                    *)local_13d0);
                        tinyusdz::value::Value::operator=
                                  ((Value *)&typed_val.
                                             super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (Value *)&typed_val_10.
                                             super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        tinyusdz::value::Value::~Value
                                  ((Value *)&typed_val_10.
                                             super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      }
                      else {
                        ::std::__cxx11::ostringstream::ostringstream(local_1548);
                        poVar3 = ::std::operator<<((ostream *)local_1548,"[error]");
                        poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                        poVar3 = ::std::operator<<(poVar3,":");
                        poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValueOfArrayType");
                        poVar3 = ::std::operator<<(poVar3,"():");
                        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xae);
                        ::std::operator<<(poVar3," ");
                        tinyusdz::value::GetTypeName_abi_cxx11_
                                  (&local_15a8,(value *)(ulong)type_id,tyid_08);
                        ::std::operator+((char *)local_1588,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)"Failed to parse value with requested type `");
                        ::std::operator+(local_1568,(char *)local_1588);
                        poVar3 = ::std::operator<<((ostream *)local_1548,(string *)local_1568);
                        ::std::operator<<(poVar3,"\n");
                        ::std::__cxx11::string::~string((string *)local_1568);
                        ::std::__cxx11::string::~string(local_1588);
                        ::std::__cxx11::string::~string((string *)&local_15a8);
                        ::std::__cxx11::ostringstream::str();
                        PushError(this,&local_15c8);
                        ::std::__cxx11::string::~string((string *)&local_15c8);
                        this_local._7_1_ = 0;
                        ::std::__cxx11::ostringstream::~ostringstream(local_1548);
                      }
                      ::std::
                      vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                      ::~vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                                 *)local_13d0);
                      if (bVar1) goto LAB_00624274;
                    }
                    else {
                      uVar2 = tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,_3UL>_>::
                              type_id();
                      if (type_id == uVar2) {
                        ::std::
                        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                  *)local_15f8);
                        bVar1 = ParseBasicTypeArray<std::array<tinyusdz::value::half,3ul>>
                                          (this,(vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                                 *)local_15f8);
                        if (bVar1) {
                          tinyusdz::value::Value::
                          Value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                                    ((Value *)&typed_val_11.
                                               super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                      *)local_15f8);
                          tinyusdz::value::Value::operator=
                                    ((Value *)&typed_val.
                                               super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (Value *)&typed_val_11.
                                               super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                          tinyusdz::value::Value::~Value
                                    ((Value *)&typed_val_11.
                                               super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        }
                        else {
                          ::std::__cxx11::ostringstream::ostringstream(local_1770);
                          poVar3 = ::std::operator<<((ostream *)local_1770,"[error]");
                          poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                          poVar3 = ::std::operator<<(poVar3,":");
                          poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValueOfArrayType");
                          poVar3 = ::std::operator<<(poVar3,"():");
                          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xaf);
                          ::std::operator<<(poVar3," ");
                          tinyusdz::value::GetTypeName_abi_cxx11_
                                    (&local_17d0,(value *)(ulong)type_id,tyid_09);
                          ::std::operator+((char *)local_17b0,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)"Failed to parse value with requested type `");
                          ::std::operator+(local_1790,(char *)local_17b0);
                          poVar3 = ::std::operator<<((ostream *)local_1770,(string *)local_1790);
                          ::std::operator<<(poVar3,"\n");
                          ::std::__cxx11::string::~string((string *)local_1790);
                          ::std::__cxx11::string::~string(local_17b0);
                          ::std::__cxx11::string::~string((string *)&local_17d0);
                          ::std::__cxx11::ostringstream::str();
                          PushError(this,&local_17f0);
                          ::std::__cxx11::string::~string((string *)&local_17f0);
                          this_local._7_1_ = 0;
                          ::std::__cxx11::ostringstream::~ostringstream(local_1770);
                        }
                        ::std::
                        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        ::~vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                   *)local_15f8);
                        if (bVar1) goto LAB_00624274;
                      }
                      else {
                        uVar2 = tinyusdz::value::TypeTraits<std::array<tinyusdz::value::half,_4UL>_>
                                ::type_id();
                        if (type_id == uVar2) {
                          ::std::
                          vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                          ::vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                    *)local_1820);
                          bVar1 = ParseBasicTypeArray<std::array<tinyusdz::value::half,4ul>>
                                            (this,(
                                                  vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                                  *)local_1820);
                          if (bVar1) {
                            tinyusdz::value::Value::
                            Value<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                                      ((Value *)&typed_val_12.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                        *)local_1820);
                            tinyusdz::value::Value::operator=
                                      ((Value *)&typed_val.
                                                 super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (Value *)&typed_val_12.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
                            tinyusdz::value::Value::~Value
                                      ((Value *)&typed_val_12.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
                          }
                          else {
                            ::std::__cxx11::ostringstream::ostringstream(local_1998);
                            poVar3 = ::std::operator<<((ostream *)local_1998,"[error]");
                            poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                            poVar3 = ::std::operator<<(poVar3,":");
                            poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValueOfArrayType");
                            poVar3 = ::std::operator<<(poVar3,"():");
                            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xb0);
                            ::std::operator<<(poVar3," ");
                            tinyusdz::value::GetTypeName_abi_cxx11_
                                      (&local_19f8,(value *)(ulong)type_id,tyid_10);
                            ::std::operator+((char *)local_19d8,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)"Failed to parse value with requested type `");
                            ::std::operator+(local_19b8,(char *)local_19d8);
                            poVar3 = ::std::operator<<((ostream *)local_1998,(string *)local_19b8);
                            ::std::operator<<(poVar3,"\n");
                            ::std::__cxx11::string::~string((string *)local_19b8);
                            ::std::__cxx11::string::~string(local_19d8);
                            ::std::__cxx11::string::~string((string *)&local_19f8);
                            ::std::__cxx11::ostringstream::str();
                            PushError(this,&local_1a18);
                            ::std::__cxx11::string::~string((string *)&local_1a18);
                            this_local._7_1_ = 0;
                            ::std::__cxx11::ostringstream::~ostringstream(local_1998);
                          }
                          ::std::
                          vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                          ::~vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                     *)local_1820);
                          if (bVar1) goto LAB_00624274;
                        }
                        else {
                          uVar2 = tinyusdz::value::TypeTraits<float>::type_id();
                          if (type_id == uVar2) {
                            ::std::vector<float,_std::allocator<float>_>::vector
                                      ((vector<float,_std::allocator<float>_> *)local_1a48);
                            bVar1 = ParseBasicTypeArray<float>
                                              (this,(vector<float,_std::allocator<float>_> *)
                                                    local_1a48);
                            if (bVar1) {
                              tinyusdz::value::Value::
                              Value<std::vector<float,std::allocator<float>>>
                                        ((Value *)&typed_val_13.
                                                                                                      
                                                  super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         ,(vector<float,_std::allocator<float>_> *)local_1a48);
                              tinyusdz::value::Value::operator=
                                        ((Value *)&typed_val.
                                                                                                      
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         ,(Value *)&typed_val_13.
                                                                                                        
                                                  super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                        );
                              tinyusdz::value::Value::~Value
                                        ((Value *)&typed_val_13.
                                                                                                      
                                                  super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                        );
                            }
                            else {
                              ::std::__cxx11::ostringstream::ostringstream(local_1bc0);
                              poVar3 = ::std::operator<<((ostream *)local_1bc0,"[error]");
                              poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                              poVar3 = ::std::operator<<(poVar3,":");
                              poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValueOfArrayType");
                              poVar3 = ::std::operator<<(poVar3,"():");
                              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xb1);
                              ::std::operator<<(poVar3," ");
                              tinyusdz::value::GetTypeName_abi_cxx11_
                                        (&local_1c20,(value *)(ulong)type_id,tyid_11);
                              ::std::operator+((char *)local_1c00,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)"Failed to parse value with requested type `");
                              ::std::operator+(local_1be0,(char *)local_1c00);
                              poVar3 = ::std::operator<<((ostream *)local_1bc0,(string *)local_1be0)
                              ;
                              ::std::operator<<(poVar3,"\n");
                              ::std::__cxx11::string::~string((string *)local_1be0);
                              ::std::__cxx11::string::~string(local_1c00);
                              ::std::__cxx11::string::~string((string *)&local_1c20);
                              ::std::__cxx11::ostringstream::str();
                              PushError(this,&local_1c40);
                              ::std::__cxx11::string::~string((string *)&local_1c40);
                              this_local._7_1_ = 0;
                              ::std::__cxx11::ostringstream::~ostringstream(local_1bc0);
                            }
                            ::std::vector<float,_std::allocator<float>_>::~vector
                                      ((vector<float,_std::allocator<float>_> *)local_1a48);
                            if (bVar1) goto LAB_00624274;
                          }
                          else {
                            uVar2 = tinyusdz::value::TypeTraits<std::array<float,_2UL>_>::type_id();
                            if (type_id == uVar2) {
                              ::std::
                              vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                              ::vector((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                        *)local_1c70);
                              bVar1 = ParseBasicTypeArray<std::array<float,2ul>>
                                                (this,(
                                                  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                                  *)local_1c70);
                              if (bVar1) {
                                tinyusdz::value::Value::
                                Value<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                                          ((Value *)&typed_val_14.
                                                                                                          
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           ,(vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                             *)local_1c70);
                                tinyusdz::value::Value::operator=
                                          ((Value *)&typed_val.
                                                                                                          
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           ,(Value *)&typed_val_14.
                                                                                                            
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          );
                                tinyusdz::value::Value::~Value
                                          ((Value *)&typed_val_14.
                                                                                                          
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          );
                              }
                              else {
                                ::std::__cxx11::ostringstream::ostringstream(local_1de8);
                                poVar3 = ::std::operator<<((ostream *)local_1de8,"[error]");
                                poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                poVar3 = ::std::operator<<(poVar3,":");
                                poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValueOfArrayType")
                                ;
                                poVar3 = ::std::operator<<(poVar3,"():");
                                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xb2);
                                ::std::operator<<(poVar3," ");
                                tinyusdz::value::GetTypeName_abi_cxx11_
                                          (&local_1e48,(value *)(ulong)type_id,tyid_12);
                                ::std::operator+((char *)local_1e28,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                ::std::operator+(local_1e08,(char *)local_1e28);
                                poVar3 = ::std::operator<<((ostream *)local_1de8,
                                                           (string *)local_1e08);
                                ::std::operator<<(poVar3,"\n");
                                ::std::__cxx11::string::~string((string *)local_1e08);
                                ::std::__cxx11::string::~string(local_1e28);
                                ::std::__cxx11::string::~string((string *)&local_1e48);
                                ::std::__cxx11::ostringstream::str();
                                PushError(this,&local_1e68);
                                ::std::__cxx11::string::~string((string *)&local_1e68);
                                this_local._7_1_ = 0;
                                ::std::__cxx11::ostringstream::~ostringstream(local_1de8);
                              }
                              ::std::
                              vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                              ::~vector((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                         *)local_1c70);
                              if (bVar1) goto LAB_00624274;
                            }
                            else {
                              uVar2 = tinyusdz::value::TypeTraits<std::array<float,_3UL>_>::type_id
                                                ();
                              if (type_id == uVar2) {
                                ::std::
                                vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                ::vector((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                          *)local_1e98);
                                bVar1 = ParseBasicTypeArray<std::array<float,3ul>>
                                                  (this,(
                                                  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  *)local_1e98);
                                if (bVar1) {
                                  tinyusdz::value::Value::
                                  Value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                                            ((Value *)&typed_val_15.
                                                                                                              
                                                  super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             ,(vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                               *)local_1e98);
                                  tinyusdz::value::Value::operator=
                                            ((Value *)&typed_val.
                                                                                                              
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             ,(Value *)&typed_val_15.
                                                                                                                
                                                  super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            );
                                  tinyusdz::value::Value::~Value
                                            ((Value *)&typed_val_15.
                                                                                                              
                                                  super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            );
                                }
                                else {
                                  ::std::__cxx11::ostringstream::ostringstream(local_2010);
                                  poVar3 = ::std::operator<<((ostream *)local_2010,"[error]");
                                  poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                  poVar3 = ::std::operator<<(poVar3,":");
                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                  poVar3 = ::std::operator<<(poVar3,"():");
                                  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xb3);
                                  ::std::operator<<(poVar3," ");
                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                            (&local_2070,(value *)(ulong)type_id,tyid_13);
                                  ::std::operator+((char *)local_2050,
                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                  ::std::operator+(local_2030,(char *)local_2050);
                                  poVar3 = ::std::operator<<((ostream *)local_2010,
                                                             (string *)local_2030);
                                  ::std::operator<<(poVar3,"\n");
                                  ::std::__cxx11::string::~string((string *)local_2030);
                                  ::std::__cxx11::string::~string(local_2050);
                                  ::std::__cxx11::string::~string((string *)&local_2070);
                                  ::std::__cxx11::ostringstream::str();
                                  PushError(this,&local_2090);
                                  ::std::__cxx11::string::~string((string *)&local_2090);
                                  this_local._7_1_ = 0;
                                  ::std::__cxx11::ostringstream::~ostringstream(local_2010);
                                }
                                ::std::
                                vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                ::~vector((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                           *)local_1e98);
                                if (bVar1) goto LAB_00624274;
                              }
                              else {
                                uVar2 = tinyusdz::value::TypeTraits<std::array<float,_4UL>_>::
                                        type_id();
                                if (type_id == uVar2) {
                                  ::std::
                                  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                  ::vector((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                            *)local_20c0);
                                  bVar1 = ParseBasicTypeArray<std::array<float,4ul>>
                                                    (this,(
                                                  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                  *)local_20c0);
                                  if (bVar1) {
                                    tinyusdz::value::Value::
                                    Value<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                                              ((Value *)&typed_val_16.
                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               ,(vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                 *)local_20c0);
                                    tinyusdz::value::Value::operator=
                                              ((Value *)&typed_val.
                                                                                                                  
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               ,(Value *)&typed_val_16.
                                                                                                                    
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              );
                                    tinyusdz::value::Value::~Value
                                              ((Value *)&typed_val_16.
                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              );
                                  }
                                  else {
                                    ::std::__cxx11::ostringstream::ostringstream(local_2238);
                                    poVar3 = ::std::operator<<((ostream *)local_2238,"[error]");
                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                    poVar3 = ::std::operator<<(poVar3,":");
                                    poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                    poVar3 = ::std::operator<<(poVar3,"():");
                                    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xb4);
                                    ::std::operator<<(poVar3," ");
                                    tinyusdz::value::GetTypeName_abi_cxx11_
                                              (&local_2298,(value *)(ulong)type_id,tyid_14);
                                    ::std::operator+((char *)local_2278,
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                    ::std::operator+(local_2258,(char *)local_2278);
                                    poVar3 = ::std::operator<<((ostream *)local_2238,
                                                               (string *)local_2258);
                                    ::std::operator<<(poVar3,"\n");
                                    ::std::__cxx11::string::~string((string *)local_2258);
                                    ::std::__cxx11::string::~string(local_2278);
                                    ::std::__cxx11::string::~string((string *)&local_2298);
                                    ::std::__cxx11::ostringstream::str();
                                    PushError(this,&local_22b8);
                                    ::std::__cxx11::string::~string((string *)&local_22b8);
                                    this_local._7_1_ = 0;
                                    ::std::__cxx11::ostringstream::~ostringstream(local_2238);
                                  }
                                  ::std::
                                  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                  ::~vector((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                             *)local_20c0);
                                  if (bVar1) goto LAB_00624274;
                                }
                                else {
                                  uVar2 = tinyusdz::value::TypeTraits<double>::type_id();
                                  if (type_id == uVar2) {
                                    ::std::vector<double,_std::allocator<double>_>::vector
                                              ((vector<double,_std::allocator<double>_> *)local_22e8
                                              );
                                    bVar1 = ParseBasicTypeArray<double>
                                                      (this,(vector<double,_std::allocator<double>_>
                                                             *)local_22e8);
                                    if (bVar1) {
                                      tinyusdz::value::Value::
                                      Value<std::vector<double,std::allocator<double>>>
                                                ((Value *)&typed_val_17.
                                                                                                                      
                                                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 ,(vector<double,_std::allocator<double>_> *)
                                                  local_22e8);
                                      tinyusdz::value::Value::operator=
                                                ((Value *)&typed_val.
                                                                                                                      
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 ,(Value *)&typed_val_17.
                                                                                                                        
                                                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                );
                                      tinyusdz::value::Value::~Value
                                                ((Value *)&typed_val_17.
                                                                                                                      
                                                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                );
                                    }
                                    else {
                                      ::std::__cxx11::ostringstream::ostringstream(local_2460);
                                      poVar3 = ::std::operator<<((ostream *)local_2460,"[error]");
                                      poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                      poVar3 = ::std::operator<<(poVar3,":");
                                      poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                      poVar3 = ::std::operator<<(poVar3,"():");
                                      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xb5);
                                      ::std::operator<<(poVar3," ");
                                      tinyusdz::value::GetTypeName_abi_cxx11_
                                                (&local_24c0,(value *)(ulong)type_id,tyid_15);
                                      ::std::operator+((char *)local_24a0,
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                      ::std::operator+(local_2480,(char *)local_24a0);
                                      poVar3 = ::std::operator<<((ostream *)local_2460,
                                                                 (string *)local_2480);
                                      ::std::operator<<(poVar3,"\n");
                                      ::std::__cxx11::string::~string((string *)local_2480);
                                      ::std::__cxx11::string::~string(local_24a0);
                                      ::std::__cxx11::string::~string((string *)&local_24c0);
                                      ::std::__cxx11::ostringstream::str();
                                      PushError(this,&local_24e0);
                                      ::std::__cxx11::string::~string((string *)&local_24e0);
                                      this_local._7_1_ = 0;
                                      ::std::__cxx11::ostringstream::~ostringstream(local_2460);
                                    }
                                    ::std::vector<double,_std::allocator<double>_>::~vector
                                              ((vector<double,_std::allocator<double>_> *)local_22e8
                                              );
                                    if (bVar1) goto LAB_00624274;
                                  }
                                  else {
                                    uVar2 = tinyusdz::value::TypeTraits<std::array<double,_2UL>_>::
                                            type_id();
                                    if (type_id == uVar2) {
                                      ::std::
                                      vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                      ::vector((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                *)local_2510);
                                      bVar1 = ParseBasicTypeArray<std::array<double,2ul>>
                                                        (this,(
                                                  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  *)local_2510);
                                      if (bVar1) {
                                        tinyusdz::value::Value::
                                        Value<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                                                  ((Value *)&typed_val_18.
                                                                                                                          
                                                  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  *)local_2510);
                                        tinyusdz::value::Value::operator=
                                                  ((Value *)&typed_val.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_18.
                                                                                                                          
                                                  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                        tinyusdz::value::Value::~Value
                                                  ((Value *)&typed_val_18.
                                                                                                                          
                                                  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                      }
                                      else {
                                        ::std::__cxx11::ostringstream::ostringstream(local_2688);
                                        poVar3 = ::std::operator<<((ostream *)local_2688,"[error]");
                                        poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                        poVar3 = ::std::operator<<(poVar3,":");
                                        poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                        poVar3 = ::std::operator<<(poVar3,"():");
                                        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xb6);
                                        ::std::operator<<(poVar3," ");
                                        tinyusdz::value::GetTypeName_abi_cxx11_
                                                  (&local_26e8,(value *)(ulong)type_id,tyid_16);
                                        ::std::operator+((char *)local_26c8,
                                                         (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                        ::std::operator+(local_26a8,(char *)local_26c8);
                                        poVar3 = ::std::operator<<((ostream *)local_2688,
                                                                   (string *)local_26a8);
                                        ::std::operator<<(poVar3,"\n");
                                        ::std::__cxx11::string::~string((string *)local_26a8);
                                        ::std::__cxx11::string::~string(local_26c8);
                                        ::std::__cxx11::string::~string((string *)&local_26e8);
                                        ::std::__cxx11::ostringstream::str();
                                        PushError(this,&local_2708);
                                        ::std::__cxx11::string::~string((string *)&local_2708);
                                        this_local._7_1_ = 0;
                                        ::std::__cxx11::ostringstream::~ostringstream(local_2688);
                                      }
                                      ::std::
                                      vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                      ::~vector((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                 *)local_2510);
                                      if (bVar1) goto LAB_00624274;
                                    }
                                    else {
                                      uVar2 = tinyusdz::value::TypeTraits<std::array<double,_3UL>_>
                                              ::type_id();
                                      if (type_id == uVar2) {
                                        ::std::
                                        vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                        ::vector((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  *)local_2738);
                                        bVar1 = ParseBasicTypeArray<std::array<double,3ul>>
                                                          (this,(
                                                  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  *)local_2738);
                                        if (bVar1) {
                                          tinyusdz::value::Value::
                                          Value<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                                                    ((Value *)&typed_val_19.
                                                                                                                              
                                                  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  *)local_2738);
                                          tinyusdz::value::Value::operator=
                                                    ((Value *)&typed_val.
                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_19.
                                                                                                                          
                                                  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                          tinyusdz::value::Value::~Value
                                                    ((Value *)&typed_val_19.
                                                                                                                              
                                                  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                        }
                                        else {
                                          ::std::__cxx11::ostringstream::ostringstream(local_28b0);
                                          poVar3 = ::std::operator<<((ostream *)local_28b0,"[error]"
                                                                    );
                                          poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                          poVar3 = ::std::operator<<(poVar3,":");
                                          poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                          poVar3 = ::std::operator<<(poVar3,"():");
                                          poVar3 = (ostream *)
                                                   ::std::ostream::operator<<(poVar3,0xb7);
                                          ::std::operator<<(poVar3," ");
                                          tinyusdz::value::GetTypeName_abi_cxx11_
                                                    (&local_2910,(value *)(ulong)type_id,tyid_17);
                                          ::std::operator+((char *)local_28f0,
                                                           (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                          ::std::operator+(local_28d0,(char *)local_28f0);
                                          poVar3 = ::std::operator<<((ostream *)local_28b0,
                                                                     (string *)local_28d0);
                                          ::std::operator<<(poVar3,"\n");
                                          ::std::__cxx11::string::~string((string *)local_28d0);
                                          ::std::__cxx11::string::~string(local_28f0);
                                          ::std::__cxx11::string::~string((string *)&local_2910);
                                          ::std::__cxx11::ostringstream::str();
                                          PushError(this,&local_2930);
                                          ::std::__cxx11::string::~string((string *)&local_2930);
                                          this_local._7_1_ = 0;
                                          ::std::__cxx11::ostringstream::~ostringstream(local_28b0);
                                        }
                                        ::std::
                                        vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                        ::~vector((
                                                  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  *)local_2738);
                                        if (bVar1) goto LAB_00624274;
                                      }
                                      else {
                                        uVar2 = tinyusdz::value::
                                                TypeTraits<std::array<double,_4UL>_>::type_id();
                                        if (type_id == uVar2) {
                                          ::std::
                                          vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                          ::vector((
                                                  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  *)local_2960);
                                          bVar1 = ParseBasicTypeArray<std::array<double,4ul>>
                                                            (this,(
                                                  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  *)local_2960);
                                          if (bVar1) {
                                            tinyusdz::value::Value::
                                            Value<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                                                      ((Value *)&typed_val_20.
                                                                                                                                  
                                                  super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  *)local_2960);
                                            tinyusdz::value::Value::operator=
                                                      ((Value *)&typed_val.
                                                                                                                                  
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_20.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                            tinyusdz::value::Value::~Value
                                                      ((Value *)&typed_val_20.
                                                                                                                                  
                                                  super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                          }
                                          else {
                                            ::std::__cxx11::ostringstream::ostringstream(local_2ad8)
                                            ;
                                            poVar3 = ::std::operator<<((ostream *)local_2ad8,
                                                                       "[error]");
                                            poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                            poVar3 = ::std::operator<<(poVar3,":");
                                            poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                            poVar3 = ::std::operator<<(poVar3,"():");
                                            poVar3 = (ostream *)
                                                     ::std::ostream::operator<<(poVar3,0xb8);
                                            ::std::operator<<(poVar3," ");
                                            tinyusdz::value::GetTypeName_abi_cxx11_
                                                      (&local_2b38,(value *)(ulong)type_id,tyid_18);
                                            ::std::operator+((char *)local_2b18,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                            ::std::operator+(local_2af8,(char *)local_2b18);
                                            poVar3 = ::std::operator<<((ostream *)local_2ad8,
                                                                       (string *)local_2af8);
                                            ::std::operator<<(poVar3,"\n");
                                            ::std::__cxx11::string::~string((string *)local_2af8);
                                            ::std::__cxx11::string::~string(local_2b18);
                                            ::std::__cxx11::string::~string((string *)&local_2b38);
                                            ::std::__cxx11::ostringstream::str();
                                            PushError(this,&local_2b58);
                                            ::std::__cxx11::string::~string((string *)&local_2b58);
                                            this_local._7_1_ = 0;
                                            ::std::__cxx11::ostringstream::~ostringstream
                                                      (local_2ad8);
                                          }
                                          ::std::
                                          vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                          ::~vector((
                                                  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  *)local_2960);
                                          if (bVar1) goto LAB_00624274;
                                        }
                                        else {
                                          uVar2 = tinyusdz::value::
                                                  TypeTraits<tinyusdz::value::quath>::type_id();
                                          if (type_id == uVar2) {
                                            ::std::
                                            vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                            ::vector((
                                                  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  *)local_2b88);
                                            bVar1 = ParseBasicTypeArray<tinyusdz::value::quath>
                                                              (this,(
                                                  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  *)local_2b88);
                                            if (bVar1) {
                                              tinyusdz::value::Value::
                                              Value<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                                                        ((Value *)&typed_val_21.
                                                                                                                                      
                                                  super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  *)local_2b88);
                                              tinyusdz::value::Value::operator=
                                                        ((Value *)&typed_val.
                                                                                                                                      
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_21.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                              tinyusdz::value::Value::~Value
                                                        ((Value *)&typed_val_21.
                                                                                                                                      
                                                  super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                            }
                                            else {
                                              ::std::__cxx11::ostringstream::ostringstream
                                                        (local_2d00);
                                              poVar3 = ::std::operator<<((ostream *)local_2d00,
                                                                         "[error]");
                                              poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                              poVar3 = ::std::operator<<(poVar3,":");
                                              poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                              poVar3 = ::std::operator<<(poVar3,"():");
                                              poVar3 = (ostream *)
                                                       ::std::ostream::operator<<(poVar3,0xb9);
                                              ::std::operator<<(poVar3," ");
                                              tinyusdz::value::GetTypeName_abi_cxx11_
                                                        (&local_2d60,(value *)(ulong)type_id,tyid_19
                                                        );
                                              ::std::operator+((char *)local_2d40,
                                                               (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                              ::std::operator+(local_2d20,(char *)local_2d40);
                                              poVar3 = ::std::operator<<((ostream *)local_2d00,
                                                                         (string *)local_2d20);
                                              ::std::operator<<(poVar3,"\n");
                                              ::std::__cxx11::string::~string((string *)local_2d20);
                                              ::std::__cxx11::string::~string(local_2d40);
                                              ::std::__cxx11::string::~string((string *)&local_2d60)
                                              ;
                                              ::std::__cxx11::ostringstream::str();
                                              PushError(this,&local_2d80);
                                              ::std::__cxx11::string::~string((string *)&local_2d80)
                                              ;
                                              this_local._7_1_ = 0;
                                              ::std::__cxx11::ostringstream::~ostringstream
                                                        (local_2d00);
                                            }
                                            ::std::
                                            vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                            ::~vector((
                                                  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  *)local_2b88);
                                            if (bVar1) goto LAB_00624274;
                                          }
                                          else {
                                            uVar2 = tinyusdz::value::
                                                    TypeTraits<tinyusdz::value::quatf>::type_id();
                                            if (type_id == uVar2) {
                                              ::std::
                                              vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                              ::vector((
                                                  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  *)local_2db0);
                                              bVar1 = ParseBasicTypeArray<tinyusdz::value::quatf>
                                                                (this,(
                                                  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  *)local_2db0);
                                              if (bVar1) {
                                                tinyusdz::value::Value::
                                                Value<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                                                          ((Value *)&typed_val_22.
                                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  *)local_2db0);
                                                tinyusdz::value::Value::operator=
                                                          ((Value *)&typed_val.
                                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_22.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                tinyusdz::value::Value::~Value
                                                          ((Value *)&typed_val_22.
                                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                              }
                                              else {
                                                ::std::__cxx11::ostringstream::ostringstream
                                                          (local_2f28);
                                                poVar3 = ::std::operator<<((ostream *)local_2f28,
                                                                           "[error]");
                                                poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                                poVar3 = ::std::operator<<(poVar3,":");
                                                poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                                poVar3 = ::std::operator<<(poVar3,"():");
                                                poVar3 = (ostream *)
                                                         ::std::ostream::operator<<(poVar3,0xba);
                                                ::std::operator<<(poVar3," ");
                                                tinyusdz::value::GetTypeName_abi_cxx11_
                                                          (&local_2f88,(value *)(ulong)type_id,
                                                           tyid_20);
                                                ::std::operator+((char *)local_2f68,
                                                                 (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                ::std::operator+(local_2f48,(char *)local_2f68);
                                                poVar3 = ::std::operator<<((ostream *)local_2f28,
                                                                           (string *)local_2f48);
                                                ::std::operator<<(poVar3,"\n");
                                                ::std::__cxx11::string::~string
                                                          ((string *)local_2f48);
                                                ::std::__cxx11::string::~string(local_2f68);
                                                ::std::__cxx11::string::~string
                                                          ((string *)&local_2f88);
                                                ::std::__cxx11::ostringstream::str();
                                                PushError(this,&local_2fa8);
                                                ::std::__cxx11::string::~string
                                                          ((string *)&local_2fa8);
                                                this_local._7_1_ = 0;
                                                ::std::__cxx11::ostringstream::~ostringstream
                                                          (local_2f28);
                                              }
                                              ::std::
                                              vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                              ::~vector((
                                                  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  *)local_2db0);
                                              if (bVar1) goto LAB_00624274;
                                            }
                                            else {
                                              uVar2 = tinyusdz::value::
                                                      TypeTraits<tinyusdz::value::quatd>::type_id();
                                              if (type_id == uVar2) {
                                                ::std::
                                                vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                ::vector((
                                                  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  *)local_2fd8);
                                                bVar1 = ParseBasicTypeArray<tinyusdz::value::quatd>
                                                                  (this,(
                                                  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  *)local_2fd8);
                                                if (bVar1) {
                                                  tinyusdz::value::Value::
                                                  Value<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>
                                                            ((Value *)&typed_val_23.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  *)local_2fd8);
                                                  tinyusdz::value::Value::operator=
                                                            ((Value *)&typed_val.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_23.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  tinyusdz::value::Value::~Value
                                                            ((Value *)&typed_val_23.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                }
                                                else {
                                                  ::std::__cxx11::ostringstream::ostringstream
                                                            (local_3150);
                                                  poVar3 = ::std::operator<<((ostream *)local_3150,
                                                                             "[error]");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0xbb);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_31b0,(value *)(ulong)type_id,
                                                             tyid_21);
                                                  ::std::operator+((char *)local_3190,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(local_3170,(char *)local_3190);
                                                  poVar3 = ::std::operator<<((ostream *)local_3150,
                                                                             (string *)local_3170);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)local_3170);
                                                  ::std::__cxx11::string::~string(local_3190);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_31b0);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_31d0);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_31d0);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_3150);
                                                }
                                                ::std::
                                                vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                ::~vector((
                                                  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  *)local_2fd8);
                                                if (bVar1) goto LAB_00624274;
                                              }
                                              else {
                                                uVar2 = tinyusdz::value::
                                                        TypeTraits<tinyusdz::value::color3f>::
                                                        type_id();
                                                if (type_id == uVar2) {
                                                  ::std::
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  *)local_3200);
                                                  bVar1 = 
                                                  ParseBasicTypeArray<tinyusdz::value::color3f>
                                                            (this,(
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  *)local_3200);
                                                  if (bVar1) {
                                                    tinyusdz::value::Value::
                                                                                                        
                                                  Value<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                                                            ((Value *)&typed_val_24.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  *)local_3200);
                                                  tinyusdz::value::Value::operator=
                                                            ((Value *)&typed_val.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_24.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  tinyusdz::value::Value::~Value
                                                            ((Value *)&typed_val_24.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_3378);
                                                    poVar3 = ::std::operator<<((ostream *)local_3378
                                                                               ,"[error]");
                                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0xbc);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_33d8,(value *)(ulong)type_id,
                                                             tyid_22);
                                                  ::std::operator+((char *)local_33b8,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(local_3398,(char *)local_33b8);
                                                  poVar3 = ::std::operator<<((ostream *)local_3378,
                                                                             (string *)local_3398);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)local_3398);
                                                  ::std::__cxx11::string::~string(local_33b8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_33d8);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_33f8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_33f8);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_3378);
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  *)local_3200);
                                                  if (bVar1) goto LAB_00624274;
                                                }
                                                else {
                                                  uVar2 = tinyusdz::value::
                                                          TypeTraits<tinyusdz::value::color4f>::
                                                          type_id();
                                                  if (type_id == uVar2) {
                                                    ::std::
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  *)local_3428);
                                                  bVar1 = 
                                                  ParseBasicTypeArray<tinyusdz::value::color4f>
                                                            (this,(
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  *)local_3428);
                                                  if (bVar1) {
                                                    tinyusdz::value::Value::
                                                                                                        
                                                  Value<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                                                            ((Value *)&typed_val_25.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  *)local_3428);
                                                  tinyusdz::value::Value::operator=
                                                            ((Value *)&typed_val.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_25.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  tinyusdz::value::Value::~Value
                                                            ((Value *)&typed_val_25.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_35a0);
                                                    poVar3 = ::std::operator<<((ostream *)local_35a0
                                                                               ,"[error]");
                                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0xbd);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_3600,(value *)(ulong)type_id,
                                                             tyid_23);
                                                  ::std::operator+((char *)local_35e0,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(local_35c0,(char *)local_35e0);
                                                  poVar3 = ::std::operator<<((ostream *)local_35a0,
                                                                             (string *)local_35c0);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)local_35c0);
                                                  ::std::__cxx11::string::~string(local_35e0);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3600);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_3620);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3620);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_35a0);
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  *)local_3428);
                                                  if (bVar1) goto LAB_00624274;
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::color3d>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      ::std::
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  *)local_3650);
                                                  bVar1 = 
                                                  ParseBasicTypeArray<tinyusdz::value::color3d>
                                                            (this,(
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  *)local_3650);
                                                  if (bVar1) {
                                                    tinyusdz::value::Value::
                                                                                                        
                                                  Value<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
                                                            ((Value *)&typed_val_26.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  *)local_3650);
                                                  tinyusdz::value::Value::operator=
                                                            ((Value *)&typed_val.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_26.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  tinyusdz::value::Value::~Value
                                                            ((Value *)&typed_val_26.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_37c8);
                                                    poVar3 = ::std::operator<<((ostream *)local_37c8
                                                                               ,"[error]");
                                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0xbe);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_3828,(value *)(ulong)type_id,
                                                             tyid_24);
                                                  ::std::operator+((char *)local_3808,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(local_37e8,(char *)local_3808);
                                                  poVar3 = ::std::operator<<((ostream *)local_37c8,
                                                                             (string *)local_37e8);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)local_37e8);
                                                  ::std::__cxx11::string::~string(local_3808);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3828);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_3848);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3848);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_37c8);
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  *)local_3650);
                                                  if (bVar1) goto LAB_00624274;
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::color4d>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      ::std::
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  *)local_3878);
                                                  bVar1 = 
                                                  ParseBasicTypeArray<tinyusdz::value::color4d>
                                                            (this,(
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  *)local_3878);
                                                  if (bVar1) {
                                                    tinyusdz::value::Value::
                                                                                                        
                                                  Value<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                                                            ((Value *)&typed_val_27.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  *)local_3878);
                                                  tinyusdz::value::Value::operator=
                                                            ((Value *)&typed_val.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_27.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  tinyusdz::value::Value::~Value
                                                            ((Value *)&typed_val_27.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_39f0);
                                                    poVar3 = ::std::operator<<((ostream *)local_39f0
                                                                               ,"[error]");
                                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0xbf);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_3a50,(value *)(ulong)type_id,
                                                             tyid_25);
                                                  ::std::operator+((char *)local_3a30,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(local_3a10,(char *)local_3a30);
                                                  poVar3 = ::std::operator<<((ostream *)local_39f0,
                                                                             (string *)local_3a10);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)local_3a10);
                                                  ::std::__cxx11::string::~string(local_3a30);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3a50);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_3a70);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3a70);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_39f0);
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  *)local_3878);
                                                  if (bVar1) goto LAB_00624274;
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::vector3f>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      ::std::
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  *)local_3aa0);
                                                  bVar1 = 
                                                  ParseBasicTypeArray<tinyusdz::value::vector3f>
                                                            (this,(
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  *)local_3aa0);
                                                  if (bVar1) {
                                                    tinyusdz::value::Value::
                                                                                                        
                                                  Value<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                                                            ((Value *)&typed_val_28.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  *)local_3aa0);
                                                  tinyusdz::value::Value::operator=
                                                            ((Value *)&typed_val.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_28.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  tinyusdz::value::Value::~Value
                                                            ((Value *)&typed_val_28.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_3c18);
                                                    poVar3 = ::std::operator<<((ostream *)local_3c18
                                                                               ,"[error]");
                                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0xc0);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_3c78,(value *)(ulong)type_id,
                                                             tyid_26);
                                                  ::std::operator+((char *)local_3c58,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(local_3c38,(char *)local_3c58);
                                                  poVar3 = ::std::operator<<((ostream *)local_3c18,
                                                                             (string *)local_3c38);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)local_3c38);
                                                  ::std::__cxx11::string::~string(local_3c58);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3c78);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_3c98);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3c98);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_3c18);
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  *)local_3aa0);
                                                  if (bVar1) goto LAB_00624274;
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::normal3f>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      ::std::
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  *)local_3cc8);
                                                  bVar1 = 
                                                  ParseBasicTypeArray<tinyusdz::value::normal3f>
                                                            (this,(
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  *)local_3cc8);
                                                  if (bVar1) {
                                                    tinyusdz::value::Value::
                                                                                                        
                                                  Value<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                                                            ((Value *)&typed_val_29.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  *)local_3cc8);
                                                  tinyusdz::value::Value::operator=
                                                            ((Value *)&typed_val.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_29.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  tinyusdz::value::Value::~Value
                                                            ((Value *)&typed_val_29.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_3e40);
                                                    poVar3 = ::std::operator<<((ostream *)local_3e40
                                                                               ,"[error]");
                                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0xc1);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_3ea0,(value *)(ulong)type_id,
                                                             tyid_27);
                                                  ::std::operator+((char *)local_3e80,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(local_3e60,(char *)local_3e80);
                                                  poVar3 = ::std::operator<<((ostream *)local_3e40,
                                                                             (string *)local_3e60);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)local_3e60);
                                                  ::std::__cxx11::string::~string(local_3e80);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3ea0);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_3ec0);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_3ec0);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_3e40);
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  *)local_3cc8);
                                                  if (bVar1) goto LAB_00624274;
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::point3f>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      ::std::
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  *)local_3ef0);
                                                  bVar1 = 
                                                  ParseBasicTypeArray<tinyusdz::value::point3f>
                                                            (this,(
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  *)local_3ef0);
                                                  if (bVar1) {
                                                    tinyusdz::value::Value::
                                                                                                        
                                                  Value<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                                                            ((Value *)&typed_val_30.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  *)local_3ef0);
                                                  tinyusdz::value::Value::operator=
                                                            ((Value *)&typed_val.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_30.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  tinyusdz::value::Value::~Value
                                                            ((Value *)&typed_val_30.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_4068);
                                                    poVar3 = ::std::operator<<((ostream *)local_4068
                                                                               ,"[error]");
                                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0xc2);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_40c8,(value *)(ulong)type_id,
                                                             tyid_28);
                                                  ::std::operator+((char *)local_40a8,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(local_4088,(char *)local_40a8);
                                                  poVar3 = ::std::operator<<((ostream *)local_4068,
                                                                             (string *)local_4088);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)local_4088);
                                                  ::std::__cxx11::string::~string(local_40a8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_40c8);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_40e8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_40e8);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_4068);
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  *)local_3ef0);
                                                  if (bVar1) goto LAB_00624274;
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::texcoord2f>
                                                            ::type_id();
                                                    if (type_id == uVar2) {
                                                      ::std::
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  *)local_4118);
                                                  bVar1 = 
                                                  ParseBasicTypeArray<tinyusdz::value::texcoord2f>
                                                            (this,(
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  *)local_4118);
                                                  if (bVar1) {
                                                    tinyusdz::value::Value::
                                                                                                        
                                                  Value<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                                                            ((Value *)&typed_val_31.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  *)local_4118);
                                                  tinyusdz::value::Value::operator=
                                                            ((Value *)&typed_val.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_31.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  tinyusdz::value::Value::~Value
                                                            ((Value *)&typed_val_31.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_4290);
                                                    poVar3 = ::std::operator<<((ostream *)local_4290
                                                                               ,"[error]");
                                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0xc3);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_42f0,(value *)(ulong)type_id,
                                                             tyid_29);
                                                  ::std::operator+((char *)local_42d0,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(local_42b0,(char *)local_42d0);
                                                  poVar3 = ::std::operator<<((ostream *)local_4290,
                                                                             (string *)local_42b0);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)local_42b0);
                                                  ::std::__cxx11::string::~string(local_42d0);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_42f0);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_4310);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4310);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_4290);
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  *)local_4118);
                                                  if (bVar1) goto LAB_00624274;
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::texcoord3f>
                                                            ::type_id();
                                                    if (type_id == uVar2) {
                                                      ::std::
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  *)local_4340);
                                                  bVar1 = 
                                                  ParseBasicTypeArray<tinyusdz::value::texcoord3f>
                                                            (this,(
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  *)local_4340);
                                                  if (bVar1) {
                                                    tinyusdz::value::Value::
                                                                                                        
                                                  Value<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                                                            ((Value *)&typed_val_32.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  *)local_4340);
                                                  tinyusdz::value::Value::operator=
                                                            ((Value *)&typed_val.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_32.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  tinyusdz::value::Value::~Value
                                                            ((Value *)&typed_val_32.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_44b8);
                                                    poVar3 = ::std::operator<<((ostream *)local_44b8
                                                                               ,"[error]");
                                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0xc4);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_4518,(value *)(ulong)type_id,
                                                             tyid_30);
                                                  ::std::operator+((char *)local_44f8,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(local_44d8,(char *)local_44f8);
                                                  poVar3 = ::std::operator<<((ostream *)local_44b8,
                                                                             (string *)local_44d8);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)local_44d8);
                                                  ::std::__cxx11::string::~string(local_44f8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4518);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_4538);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4538);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_44b8);
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  *)local_4340);
                                                  if (bVar1) goto LAB_00624274;
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::matrix2f>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      ::std::
                                                  vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                                                  *)local_4568);
                                                  bVar1 = 
                                                  ParseBasicTypeArray<tinyusdz::value::matrix2f>
                                                            (this,(
                                                  vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                                                  *)local_4568);
                                                  if (bVar1) {
                                                    tinyusdz::value::Value::
                                                                                                        
                                                  Value<std::vector<tinyusdz::value::matrix2f,std::allocator<tinyusdz::value::matrix2f>>>
                                                            ((Value *)&typed_val_33.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                                                  *)local_4568);
                                                  tinyusdz::value::Value::operator=
                                                            ((Value *)&typed_val.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_33.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  tinyusdz::value::Value::~Value
                                                            ((Value *)&typed_val_33.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_46e0);
                                                    poVar3 = ::std::operator<<((ostream *)local_46e0
                                                                               ,"[error]");
                                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0xc5);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_4740,(value *)(ulong)type_id,
                                                             tyid_31);
                                                  ::std::operator+((char *)local_4720,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(local_4700,(char *)local_4720);
                                                  poVar3 = ::std::operator<<((ostream *)local_46e0,
                                                                             (string *)local_4700);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)local_4700);
                                                  ::std::__cxx11::string::~string(local_4720);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4740);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_4760);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4760);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_46e0);
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                                                  *)local_4568);
                                                  if (bVar1) goto LAB_00624274;
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::matrix3f>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      ::std::
                                                  vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                                                  *)local_4790);
                                                  bVar1 = 
                                                  ParseBasicTypeArray<tinyusdz::value::matrix3f>
                                                            (this,(
                                                  vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                                                  *)local_4790);
                                                  if (bVar1) {
                                                    tinyusdz::value::Value::
                                                                                                        
                                                  Value<std::vector<tinyusdz::value::matrix3f,std::allocator<tinyusdz::value::matrix3f>>>
                                                            ((Value *)&typed_val_34.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                                                  *)local_4790);
                                                  tinyusdz::value::Value::operator=
                                                            ((Value *)&typed_val.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_34.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  tinyusdz::value::Value::~Value
                                                            ((Value *)&typed_val_34.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_4908);
                                                    poVar3 = ::std::operator<<((ostream *)local_4908
                                                                               ,"[error]");
                                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0xc6);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_4968,(value *)(ulong)type_id,
                                                             tyid_32);
                                                  ::std::operator+((char *)local_4948,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(local_4928,(char *)local_4948);
                                                  poVar3 = ::std::operator<<((ostream *)local_4908,
                                                                             (string *)local_4928);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)local_4928);
                                                  ::std::__cxx11::string::~string(local_4948);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4968);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_4988);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4988);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_4908);
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                                                  *)local_4790);
                                                  if (bVar1) goto LAB_00624274;
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::matrix4f>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      ::std::
                                                  vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                                                  *)local_49b8);
                                                  bVar1 = 
                                                  ParseBasicTypeArray<tinyusdz::value::matrix4f>
                                                            (this,(
                                                  vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                                                  *)local_49b8);
                                                  if (bVar1) {
                                                    tinyusdz::value::Value::
                                                                                                        
                                                  Value<std::vector<tinyusdz::value::matrix4f,std::allocator<tinyusdz::value::matrix4f>>>
                                                            ((Value *)&typed_val_35.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                                                  *)local_49b8);
                                                  tinyusdz::value::Value::operator=
                                                            ((Value *)&typed_val.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_35.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  tinyusdz::value::Value::~Value
                                                            ((Value *)&typed_val_35.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_4b30);
                                                    poVar3 = ::std::operator<<((ostream *)local_4b30
                                                                               ,"[error]");
                                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,199);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_4b90,(value *)(ulong)type_id,
                                                             tyid_33);
                                                  ::std::operator+((char *)local_4b70,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(local_4b50,(char *)local_4b70);
                                                  poVar3 = ::std::operator<<((ostream *)local_4b30,
                                                                             (string *)local_4b50);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)local_4b50);
                                                  ::std::__cxx11::string::~string(local_4b70);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4b90);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_4bb0);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4bb0);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_4b30);
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                                                  *)local_49b8);
                                                  if (bVar1) goto LAB_00624274;
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::matrix2d>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      ::std::
                                                  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                                                  *)local_4be0);
                                                  bVar1 = 
                                                  ParseBasicTypeArray<tinyusdz::value::matrix2d>
                                                            (this,(
                                                  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                                                  *)local_4be0);
                                                  if (bVar1) {
                                                    tinyusdz::value::Value::
                                                                                                        
                                                  Value<std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>>
                                                            ((Value *)&typed_val_36.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                                                  *)local_4be0);
                                                  tinyusdz::value::Value::operator=
                                                            ((Value *)&typed_val.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_36.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  tinyusdz::value::Value::~Value
                                                            ((Value *)&typed_val_36.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_4d58);
                                                    poVar3 = ::std::operator<<((ostream *)local_4d58
                                                                               ,"[error]");
                                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,200);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_4db8,(value *)(ulong)type_id,
                                                             tyid_34);
                                                  ::std::operator+((char *)local_4d98,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(local_4d78,(char *)local_4d98);
                                                  poVar3 = ::std::operator<<((ostream *)local_4d58,
                                                                             (string *)local_4d78);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)local_4d78);
                                                  ::std::__cxx11::string::~string(local_4d98);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4db8);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_4dd8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4dd8);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_4d58);
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                                                  *)local_4be0);
                                                  if (bVar1) goto LAB_00624274;
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::matrix3d>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      ::std::
                                                  vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                                                  *)local_4e08);
                                                  bVar1 = 
                                                  ParseBasicTypeArray<tinyusdz::value::matrix3d>
                                                            (this,(
                                                  vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                                                  *)local_4e08);
                                                  if (bVar1) {
                                                    tinyusdz::value::Value::
                                                                                                        
                                                  Value<std::vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>>
                                                            ((Value *)&typed_val_37.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(
                                                  vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                                                  *)local_4e08);
                                                  tinyusdz::value::Value::operator=
                                                            ((Value *)&typed_val.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(Value *)&typed_val_37.
                                                                                                                          
                                                  super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  tinyusdz::value::Value::~Value
                                                            ((Value *)&typed_val_37.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_4f80);
                                                    poVar3 = ::std::operator<<((ostream *)local_4f80
                                                                               ,"[error]");
                                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0xc9);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_4fe0,(value *)(ulong)type_id,
                                                             tyid_35);
                                                  ::std::operator+((char *)local_4fc0,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(local_4fa0,(char *)local_4fc0);
                                                  poVar3 = ::std::operator<<((ostream *)local_4f80,
                                                                             (string *)local_4fa0);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)local_4fa0);
                                                  ::std::__cxx11::string::~string(local_4fc0);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_4fe0);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_5000);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_5000);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_4f80);
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                                                  *)local_4e08);
                                                  if (bVar1) goto LAB_00624274;
                                                  }
                                                  else {
                                                    uVar2 = tinyusdz::value::
                                                            TypeTraits<tinyusdz::value::matrix4d>::
                                                            type_id();
                                                    if (type_id == uVar2) {
                                                      ::std::
                                                  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                                  *)local_5030);
                                                  bVar1 = 
                                                  ParseBasicTypeArray<tinyusdz::value::matrix4d>
                                                            (this,(
                                                  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                                  *)local_5030);
                                                  if (bVar1) {
                                                    tinyusdz::value::Value::
                                                                                                        
                                                  Value<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                                                            (&local_5240,
                                                             (
                                                  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                                  *)local_5030);
                                                  tinyusdz::value::Value::operator=
                                                            ((Value *)&typed_val.
                                                                                                                                              
                                                  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,&local_5240);
                                                  tinyusdz::value::Value::~Value(&local_5240);
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_51a8);
                                                    poVar3 = ::std::operator<<((ostream *)local_51a8
                                                                               ,"[error]");
                                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0xca);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_5208,(value *)(ulong)type_id,
                                                             tyid_36);
                                                  ::std::operator+((char *)local_51e8,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"Failed to parse value with requested type `");
                                                  ::std::operator+(local_51c8,(char *)local_51e8);
                                                  poVar3 = ::std::operator<<((ostream *)local_51a8,
                                                                             (string *)local_51c8);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string
                                                            ((string *)local_51c8);
                                                  ::std::__cxx11::string::~string(local_51e8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_5208);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_5228);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_5228);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_51a8);
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                                  *)local_5030);
                                                  if (bVar1) goto LAB_00624274;
                                                  }
                                                  else {
                                                    ::std::__cxx11::ostringstream::ostringstream
                                                              (local_53b8);
                                                    poVar3 = ::std::operator<<((ostream *)local_53b8
                                                                               ,"[error]");
                                                    poVar3 = ::std::operator<<(poVar3,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                                                  );
                                                  poVar3 = ::std::operator<<(poVar3,":");
                                                  poVar3 = ::std::operator<<(poVar3,
                                                  "ParseTimeSampleValueOfArrayType");
                                                  poVar3 = ::std::operator<<(poVar3,"():");
                                                  poVar3 = (ostream *)
                                                           ::std::ostream::operator<<(poVar3,0xcb);
                                                  ::std::operator<<(poVar3," ");
                                                  tinyusdz::value::GetTypeName_abi_cxx11_
                                                            (&local_53f8,(value *)(ulong)type_id,
                                                             tyid_37);
                                                  ::std::operator+((char *)local_53d8,
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)" : TODO: timeSamples type ");
                                                  poVar3 = ::std::operator<<((ostream *)local_53b8,
                                                                             local_53d8);
                                                  ::std::operator<<(poVar3,"\n");
                                                  ::std::__cxx11::string::~string(local_53d8);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_53f8);
                                                  ::std::__cxx11::ostringstream::str();
                                                  PushError(this,&local_5418);
                                                  ::std::__cxx11::string::~string
                                                            ((string *)&local_5418);
                                                  this_local._7_1_ = 0;
                                                  ::std::__cxx11::ostringstream::~ostringstream
                                                            (local_53b8);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  tinyusdz::value::Value::~Value
            ((Value *)&typed_val.
                       super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_00624298:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParseTimeSampleValueOfArrayType(const uint32_t type_id, value::Value *result) {

  if (!result) {
    return false;
  }

  if (MaybeNone()) {
    (*result) = value::ValueBlock();
    return true;
  }

  value::Value val;

#define PARSE_TYPE(__tyid, __type)                       \
  if (__tyid == value::TypeTraits<__type>::type_id()) {             \
    std::vector<__type> typed_val; \
    if (!ParseBasicTypeArray(&typed_val)) {                             \
      PUSH_ERROR_AND_RETURN("Failed to parse value with requested type `" + value::GetTypeName(__tyid) + "[]`"); \
    }                                                                  \
    val = value::Value(typed_val); \
  } else

  // NOTE: `string` does not support multi-line string.
  PARSE_TYPE(type_id, value::AssetPath)
  PARSE_TYPE(type_id, value::token)
  PARSE_TYPE(type_id, std::string)
  PARSE_TYPE(type_id, float)
  PARSE_TYPE(type_id, int32_t)
  PARSE_TYPE(type_id, uint32_t)
  PARSE_TYPE(type_id, int64_t)
  PARSE_TYPE(type_id, uint64_t)
  PARSE_TYPE(type_id, value::half)
  PARSE_TYPE(type_id, value::half2)
  PARSE_TYPE(type_id, value::half3)
  PARSE_TYPE(type_id, value::half4)
  PARSE_TYPE(type_id, float)
  PARSE_TYPE(type_id, value::float2)
  PARSE_TYPE(type_id, value::float3)
  PARSE_TYPE(type_id, value::float4)
  PARSE_TYPE(type_id, double)
  PARSE_TYPE(type_id, value::double2)
  PARSE_TYPE(type_id, value::double3)
  PARSE_TYPE(type_id, value::double4)
  PARSE_TYPE(type_id, value::quath)
  PARSE_TYPE(type_id, value::quatf)
  PARSE_TYPE(type_id, value::quatd)
  PARSE_TYPE(type_id, value::color3f)
  PARSE_TYPE(type_id, value::color4f)
  PARSE_TYPE(type_id, value::color3d)
  PARSE_TYPE(type_id, value::color4d)
  PARSE_TYPE(type_id, value::vector3f)
  PARSE_TYPE(type_id, value::normal3f)
  PARSE_TYPE(type_id, value::point3f)
  PARSE_TYPE(type_id, value::texcoord2f)
  PARSE_TYPE(type_id, value::texcoord3f)
  PARSE_TYPE(type_id, value::matrix2f)
  PARSE_TYPE(type_id, value::matrix3f)
  PARSE_TYPE(type_id, value::matrix4f)
  PARSE_TYPE(type_id, value::matrix2d)
  PARSE_TYPE(type_id, value::matrix3d)
  PARSE_TYPE(type_id, value::matrix4d) {
    PUSH_ERROR_AND_RETURN(" : TODO: timeSamples type " + value::GetTypeName(type_id));
  }

#undef PARSE_TYPE

  (*result) = val;

  return true;

}